

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_face_flux
               (Mesh *old_mesh,Mesh *new_mesh,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               LOs *prods2new_ents)

{
  bool bVar1;
  Int IVar2;
  TagBase *this;
  string *__lhs;
  Read<double> local_f8;
  Read<int> local_e8;
  Read<int> local_d8;
  Read<int> local_c8 [2];
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  Read<double> prod_data;
  Read<double> old_data;
  TagBase *tagbase;
  Int i;
  LOs *prods2new_ents_local;
  LOs *same_ents2new_ents_local;
  LOs *same_ents2old_ents_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  ulong local_10;
  
  for (tagbase._4_4_ = 0; IVar2 = Mesh::ntags(old_mesh,2), tagbase._4_4_ < IVar2;
      tagbase._4_4_ = tagbase._4_4_ + 1) {
    this = Mesh::get_tag(old_mesh,2,tagbase._4_4_);
    __lhs = TagBase::name_abi_cxx11_(this);
    bVar1 = std::operator==(__lhs,"magnetic face flux");
    if (bVar1) {
      TagBase::name_abi_cxx11_(this);
      Mesh::get_array<double>
                ((Mesh *)&prod_data.write_.shared_alloc_.direct_ptr,(Int)old_mesh,(string *)0x2);
      if (((ulong)(prods2new_ents->write_).shared_alloc_.alloc & 1) == 0) {
        local_10 = ((prods2new_ents->write_).shared_alloc_.alloc)->size;
      }
      else {
        local_10 = (ulong)(prods2new_ents->write_).shared_alloc_.alloc >> 3;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"",&local_a1);
      Read<double>::Read((Read<double> *)local_80,(LO)(local_10 >> 2),0.0,(string *)local_a0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      Read<int>::Read(local_c8,same_ents2old_ents);
      Read<int>::Read(&local_d8,same_ents2new_ents);
      Read<int>::Read(&local_e8,prods2new_ents);
      Read<double>::Read(&local_f8,(Read<double> *)local_80);
      transfer_common<double>(old_mesh,new_mesh,2,local_c8,&local_d8,&local_e8,this,&local_f8);
      Read<double>::~Read(&local_f8);
      Read<int>::~Read(&local_e8);
      Read<int>::~Read(&local_d8);
      Read<int>::~Read(local_c8);
      Read<double>::~Read((Read<double> *)local_80);
      Read<double>::~Read((Read<double> *)&prod_data.write_.shared_alloc_.direct_ptr);
    }
  }
  return;
}

Assistant:

static void transfer_face_flux(Mesh* old_mesh, Mesh* new_mesh,
    LOs same_ents2old_ents, LOs same_ents2new_ents, LOs prods2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(FACE); ++i) {
    TagBase const* tagbase = old_mesh->get_tag(FACE, i);
    if (tagbase->name() == "magnetic face flux") {
      Read<Real> old_data = old_mesh->get_array<Real>(FACE, tagbase->name());
      Read<Real> prod_data(prods2new_ents.size(), 0);
      transfer_common(old_mesh, new_mesh, FACE, same_ents2old_ents,
          same_ents2new_ents, prods2new_ents, tagbase, prod_data);
    }
  }
}